

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

vm_prop_id_t __thiscall CVmImageLoader::alloc_new_prop(CVmImageLoader *this)

{
  CVmObjPageEntry *pCVar1;
  uint uVar2;
  vm_val_t val;
  vm_val_t idx_val;
  vm_val_t new_cont;
  vm_val_t vStack_48;
  vm_val_t local_38;
  vm_val_t local_28;
  
  uVar2 = G_predef_X.last_prop_obj & 0xfff;
  pCVar1 = G_obj_table_X.pages_[G_predef_X.last_prop_obj >> 0xc];
  local_38.typ = VM_INT;
  local_38.val.obj = 1;
  CVmObject::index_val((CVmObject *)(pCVar1 + uVar2),&vStack_48,G_predef_X.last_prop_obj,&local_38);
  if (vStack_48.val.prop != 0xffff) {
    vStack_48.val.prop = vStack_48.val.prop + 1;
    CVmObject::set_index_val
              ((CVmObject *)(pCVar1 + uVar2),&local_28,G_predef_X.last_prop_obj,&local_38,&vStack_48
              );
    return vStack_48.val.prop;
  }
  err_throw(0xcd);
}

Assistant:

vm_prop_id_t CVmImageLoader::alloc_new_prop(VMG0_)
{
    CVmObjVector *vec;
    vm_val_t idx_val;
    vm_val_t val;
    vm_val_t new_cont;

    /* get the LastPropObj vector */
    vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   get the element at index 1 - our last property value is always at
     *   the first element 
     */
    idx_val.set_int(1);

    /* get the value from the vector */
    vec->index_val(vmg_ &val, G_predef->last_prop_obj, &idx_val);

    /* if we've allocated every available property ID, throw an error */
    if (val.val.prop == 65535)
        err_throw(VMERR_OUT_OF_PROPIDS);

    /* allocate the new property ID by incrementing the last used ID */
    ++val.val.prop;

    /* 
     *   update the vector with the new value (this new property ID is now
     *   the last property ID in use) 
     */
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &val);

    /* return the new last ID */
    return val.val.prop;
}